

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void tcg_gen_lookup_and_goto_ptr_m68k(TCGContext_conflict2 *tcg_ctx)

{
  TCGTemp *ret;
  TCGOp *pTVar1;
  TCGTemp *local_18;
  
  ret = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I64,false);
  local_18 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  tcg_gen_callN_m68k(tcg_ctx,helper_lookup_tb_ptr_m68k,ret,1,&local_18);
  pTVar1 = tcg_emit_op_m68k(tcg_ctx,INDEX_op_goto_ptr);
  pTVar1->args[0] = (TCGArg)ret;
  tcg_temp_free_internal_m68k(tcg_ctx,ret);
  return;
}

Assistant:

void tcg_gen_lookup_and_goto_ptr(TCGContext *tcg_ctx)
{
#if TCG_TARGET_HAS_goto_ptr
        TCGv_ptr ptr;

        ptr = tcg_temp_new_ptr(tcg_ctx);
        gen_helper_lookup_tb_ptr(tcg_ctx, ptr, tcg_ctx->cpu_env);
        tcg_gen_op1i(tcg_ctx, INDEX_op_goto_ptr, tcgv_ptr_arg(tcg_ctx, ptr));
        tcg_temp_free_ptr(tcg_ctx, ptr);
#else
        tcg_gen_exit_tb(tcg_ctx, NULL, 0);
#endif
}